

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O2

matrix * __thiscall matrix::operator*(matrix *__return_storage_ptr__,matrix *this,matrix *other)

{
  polynomial local_98;
  polynomial local_78;
  polynomial local_58;
  polynomial *local_38;
  
  matrix(__return_storage_ptr__,
         (long)(this->p00).p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->p00).p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3,this->n);
  polynomial::operator*(&local_78,&this->p00,&other->p00);
  polynomial::operator*(&local_98,&this->p01,&other->p10);
  local_38 = &other->p10;
  polynomial::operator+(&local_58,&local_78,&local_98);
  polynomial::operator=(&__return_storage_ptr__->p00,&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_58.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_98.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_78.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  polynomial::operator*(&local_78,&this->p00,&other->p01);
  polynomial::operator*(&local_98,&this->p01,&other->p11);
  polynomial::operator+(&local_58,&local_78,&local_98);
  polynomial::operator=(&__return_storage_ptr__->p01,&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_58.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_98.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_78.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  polynomial::operator*(&local_78,&this->p10,&other->p00);
  polynomial::operator*(&local_98,&this->p11,local_38);
  polynomial::operator+(&local_58,&local_78,&local_98);
  polynomial::operator=(&__return_storage_ptr__->p10,&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_58.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_98.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_78.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  polynomial::operator*(&local_78,&this->p10,&other->p01);
  polynomial::operator*(&local_98,&this->p11,&other->p11);
  polynomial::operator+(&local_58,&local_78,&local_98);
  polynomial::operator=(&__return_storage_ptr__->p11,&local_58);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_58.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_98.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_78.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

matrix operator* (const matrix& other){
        uint64_t r = p00.p.size();
        matrix ret(r, n);
        ret.p00 = this->p00*other.p00 + this->p01*other.p10;
        ret.p01 = this->p00*other.p01 + this->p01*other.p11;
        ret.p10 = this->p10*other.p00 + this->p11*other.p10;
        ret.p11 = this->p10*other.p01 + this->p11*other.p11;
        return ret;
    }